

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_thread.cpp
# Opt level: O2

void __thiscall tst_thread::resolve_void(tst_thread *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar2;
  QThread *t1;
  bool bVar3;
  char cVar4;
  PromiseDataBase<void,_void_()> *this_00;
  RunFunctionTaskBase<void> *this_01;
  PromiseData<void> *this_02;
  undefined8 *puVar5;
  QObject *t2;
  QPromiseReject<void> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_108;
  PromiseResolver<void> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_f8;
  QPromiseBase<void> local_f0;
  int value;
  QPromiseBase<void> local_d8;
  PromiseResolver<void> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_c0;
  DecayedTuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
  tuple;
  QPromiseBase<void> local_98;
  QThread *source;
  QThread *target;
  QPromiseBase<void> local_78;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  QPromiseBase<void> local_40;
  
  value = -1;
  target = (QThread *)0x0;
  source = (QThread *)0x0;
  local_d8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118908;
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  ((PromiseDataBase<void,_void_()> *)&this_00->_vptr_PromiseDataBase)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_00);
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_f0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118a20;
  local_f0.m_d.d = (PromiseData<void> *)this_00;
  local_d8.m_d.d = (PromiseData<void> *)this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_f0);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_f0);
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_108.d = (Data *)0x0;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)&source;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_f8 = resolver.m_d.d;
  local_c0 = resolver.m_d.d;
  local_68._M_unused._0_8_ = (undefined8)QThreadPool::globalInstance();
  tuple.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
  .
  super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
  ._M_head_impl.source = (QThread **)resolver_1.m_d.d;
  tuple.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
  .
  super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
  ._M_head_impl.resolve.m_resolver.m_d.d = (PromiseResolver<void>)(PromiseResolver<void>)local_c0.d;
  if (local_c0.d != (Data *)0x0) {
    LOCK();
    ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68._8_8_ = (ulong)(uint)local_68._12_4_ << 0x20;
  this_01 = (RunFunctionTaskBase<void> *)operator_new(0x30);
  QtConcurrent::RunFunctionTaskBase<void>::RunFunctionTaskBase(this_01);
  *(undefined ***)this_01 = &PTR_run_00118858;
  *(QThread ***)(this_01 + 1) =
       tuple.
       super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
       .
       super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
       ._M_head_impl.source;
  *(PromiseResolver<void> *)&this_01[1].field_0x8 =
       tuple.
       super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
       .
       super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
       ._M_head_impl.resolve.m_resolver.m_d.d;
  if ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
      tuple.
      super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
      .
      super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
      ._M_head_impl.resolve.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)0x0) {
    LOCK();
    *(int *)tuple.
            super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
            .
            super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
            ._M_head_impl.resolve.m_resolver.m_d.d =
         *(int *)tuple.
                 super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
                 .
                 super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
                 ._M_head_impl.resolve.m_resolver.m_d.d + 1;
    UNLOCK();
  }
  QtConcurrent::RunFunctionTaskBase<void>::start
            ((QFuture<void> *)&local_78,this_01,(TaskStartParameters *)&local_68);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &tuple.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
              .
              super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
              ._M_head_impl.resolve);
  QFutureInterfaceBase::~QFutureInterfaceBase((QFutureInterfaceBase *)&local_78);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_c0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_f8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_108);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_d8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118a20;
  local_98._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118908;
  this_02 = (PromiseData<void> *)operator_new(0x58);
  (this_02->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (this_02->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(this_02);
  LOCK();
  pQVar1 = &(this_02->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_02 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(this_02->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118a20;
  local_98.m_d.d = this_02;
  local_78.m_d.d = this_02;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&local_78);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_78);
  QVar2.d = local_d8.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_f0._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_f0._vptr_QPromiseBase = (_func_int **)resolver_1;
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  if ((Data *)local_f0._vptr_QPromiseBase == (Data *)0x0) {
    local_f8.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_f0._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_f0._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_f8.d = (Data *)local_f0._vptr_QPromiseBase;
  }
  local_108.d = (Data *)0x0;
  if ((Data *)local_f0._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((Data *)local_f0._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_f0._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_f8.d != (Data *)0x0) {
    LOCK();
    *(int *)local_f8.d = *(int *)local_f8.d + 1;
    UNLOCK();
  }
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  tuple.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
  .
  super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
  ._M_head_impl.source = (QThread **)local_f0._vptr_QPromiseBase;
  tuple.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
  .
  super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
  ._M_head_impl.resolve.m_resolver.m_d.d = (PromiseResolver<void>)(PromiseResolver<void>)local_f8.d;
  puVar5 = (undefined8 *)operator_new(0x20);
  *puVar5 = tuple.
            super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
            .
            super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
            ._M_head_impl.source;
  if (tuple.
      super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
      .
      super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
      ._M_head_impl.source != (QThread **)0x0) {
    LOCK();
    *(int *)tuple.
            super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
            .
            super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
            ._M_head_impl.source =
         *(int *)tuple.
                 super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
                 .
                 super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
                 ._M_head_impl.source + 1;
    UNLOCK();
  }
  puVar5[1] = tuple.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
              .
              super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
              ._M_head_impl.resolve.m_resolver.m_d.d;
  if ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
      tuple.
      super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
      .
      super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
      ._M_head_impl.resolve.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)0x0) {
    LOCK();
    *(int *)tuple.
            super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
            .
            super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
            ._M_head_impl.resolve.m_resolver.m_d.d =
         *(int *)tuple.
                 super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41)>
                 .
                 super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_thread_tst_thread_cpp:61:41),_false>
                 ._M_head_impl.resolve.m_resolver.m_d.d + 1;
    UNLOCK();
  }
  puVar5[2] = &target;
  puVar5[3] = &value;
  pcStack_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
             ::_M_manager;
  local_68._M_unused._M_object = puVar5;
  QtPromisePrivate::PromiseHandler<void,tst_thread::resolve_void()::$_1,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_thread::resolve_void()::$_1_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)&tuple);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,(function<void_()> *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  QVar2.d = local_d8.m_d.d;
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&tuple,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_f0,
             (QPromiseResolve<void> *)&local_f8,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&tuple);
  std::_Function_base::~_Function_base((_Function_base *)&tuple);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_f8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_108);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_f0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  local_98._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118a20;
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(local_d8.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(local_d8.m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  QtPromise::QPromiseBase<void>::wait(&local_40,&local_98);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_40);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_98);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_d8);
  cVar4 = QTest::qVerify(source != (QThread *)0x0,"source != nullptr","",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                         ,0x48);
  if (cVar4 != '\0') {
    cVar4 = QTest::qVerify(source != target,"source != target","",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                           ,0x49);
    t1 = target;
    if (cVar4 != '\0') {
      t2 = (QObject *)QThread::currentThread();
      bVar3 = QTest::compare_ptr_helper
                        ((QObject *)t1,t2,"target","QThread::currentThread()",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                         ,0x4a);
      if (bVar3) {
        QTest::qCompare(value,0x2b,"value","43",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                        ,0x4b);
      }
    }
  }
  return;
}

Assistant:

void tst_thread::resolve_void()
{
    int value = -1;
    QThread* target = nullptr;
    QThread* source = nullptr;

    QtPromise::QPromise<void>{[&](const QtPromise::QPromiseResolve<void>& resolve) {
        std::ignore = QtConcurrent::run([=, &source]() {
            source = QThread::currentThread();
            resolve();
        });
    }}
        .then([&]() {
            target = QThread::currentThread();
            value = 43;
        })
        .wait();

    QVERIFY(source != nullptr);
    QVERIFY(source != target);
    QCOMPARE(target, QThread::currentThread());
    QCOMPARE(value, 43);
}